

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::eliminatePivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int prow,int pos,
                number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *eps)

{
  uint *puVar1;
  int *piVar2;
  pointer pnVar3;
  Pring *pPVar4;
  Pring *pPVar5;
  Pring *pPVar6;
  int *piVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps_00;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  eps_01;
  int *piVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  int *piVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  undefined3 in_stack_fffffffffffffdc0;
  undefined4 uVar21;
  int32_t iVar22;
  fpclass_type fVar23;
  int iVar24;
  undefined4 in_stack_fffffffffffffdd8;
  int pcol;
  int iVar25;
  undefined4 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_e8;
  undefined1 local_e4;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  undefined1 local_94;
  undefined8 local_90;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_88;
  
  piVar2 = (this->u).row.len;
  lVar18 = (long)(this->u).row.start[prow];
  iVar13 = piVar2[prow];
  iVar16 = iVar13 + -1;
  piVar2[prow] = iVar16;
  lVar15 = pos + lVar18;
  pnVar3 = (this->u).row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (this->u).row.idx;
  iVar25 = piVar2[lVar15];
  uVar27 = *(undefined8 *)pnVar3[lVar15].m_backend.data._M_elems;
  uVar28 = *(undefined8 *)((long)pnVar3[lVar15].m_backend.data._M_elems + 8);
  puVar1 = (uint *)((long)pnVar3[lVar15].m_backend.data._M_elems + 0x10);
  uVar29 = *(undefined8 *)puVar1;
  uVar30 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)pnVar3[lVar15].m_backend.data._M_elems + 0x20);
  uVar8 = *(undefined8 *)puVar1;
  uVar9 = *(undefined8 *)(puVar1 + 2);
  puVar1 = (uint *)((long)pnVar3[lVar15].m_backend.data._M_elems + 0x30);
  uVar10 = *(undefined8 *)puVar1;
  uVar11 = *(undefined8 *)(puVar1 + 2);
  iVar24 = pnVar3[lVar15].m_backend.exp;
  lVar20 = (long)iVar25;
  uVar21 = CONCAT13(pnVar3[lVar15].m_backend.neg,in_stack_fffffffffffffdc0);
  fVar23 = pnVar3[lVar15].m_backend.fpclass;
  iVar22 = pnVar3[lVar15].m_backend.prec_elem;
  pPVar4 = (this->temp).pivot_col;
  pPVar5 = pPVar4[lVar20].next;
  pPVar6 = pPVar4[lVar20].prev;
  pPVar5->prev = pPVar6;
  pPVar6->next = pPVar5;
  pPVar4[lVar20].next = pPVar4 + lVar20;
  pPVar4[lVar20].prev = pPVar4 + lVar20;
  lVar19 = (long)iVar13 + -1 + lVar18;
  piVar2[lVar15] = piVar2[lVar19];
  pcol = iVar25;
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
            (&pnVar3[lVar15].m_backend,&pnVar3[lVar19].m_backend);
  iVar13 = (this->temp).stage;
  (this->temp).stage = iVar13 + 1;
  local_88.m_backend.neg = SUB41((uint)uVar21 >> 0x18,0);
  local_88.m_backend.data._M_elems._0_8_ = uVar27;
  local_88.m_backend.data._M_elems._8_8_ = uVar28;
  local_88.m_backend.data._M_elems._16_8_ = uVar29;
  local_88.m_backend.data._M_elems._24_8_ = uVar30;
  local_88.m_backend.data._M_elems._32_8_ = uVar8;
  local_88.m_backend.data._M_elems._40_8_ = uVar9;
  local_88.m_backend.data._M_elems._48_8_ = uVar10;
  local_88.m_backend.data._M_elems._56_8_ = uVar11;
  local_88.m_backend.exp = iVar24;
  local_88.m_backend.fpclass = fVar23;
  local_88.m_backend.prec_elem = iVar22;
  setPivot(this,iVar13,iVar25,prow,&local_88);
  iVar13 = (this->temp).s_cact[lVar20];
  if (iVar13 < 2) {
    iVar13 = -1;
  }
  else {
    iVar13 = makeLvec(this,iVar13 + -1,prow);
  }
  for (; lVar18 < lVar19; lVar18 = lVar18 + 1) {
    iVar25 = (this->u).row.idx[lVar18];
    (this->temp).s_mark[iVar25] = 1;
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&this->work[iVar25].m_backend,
               &(this->u).row.val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend);
    pPVar4 = (this->temp).pivot_col;
    pPVar5 = pPVar4[iVar25].next;
    pPVar4 = pPVar4[iVar25].prev;
    pPVar5->prev = pPVar4;
    pPVar4->next = pPVar5;
    piVar7 = (this->u).col.idx;
    piVar2 = (this->temp).s_cact;
    iVar14 = ((this->u).col.len[iVar25] + (this->u).col.start[iVar25]) - piVar2[iVar25];
    piVar12 = piVar7 + iVar14;
    do {
      piVar17 = piVar12;
      piVar12 = piVar17 + 1;
    } while (*piVar17 != prow);
    *piVar17 = piVar7[iVar14];
    piVar7[iVar14] = prow;
    piVar2 = piVar2 + iVar25;
    *piVar2 = *piVar2 + -1;
  }
  for (lVar15 = (long)((this->u).col.len[lVar20] - (this->temp).s_cact[lVar20]);
      uVar26 = (undefined4)((ulong)lVar19 >> 0x20),
      iVar25 = (this->u).col.idx[(this->u).col.start[lVar20] + lVar15], iVar25 != prow;
      lVar15 = lVar15 + 1) {
    local_178.m_backend.neg = SUB41((uint)uVar21 >> 0x18,0);
    local_d8 = *(undefined8 *)(eps->m_backend).data._M_elems;
    uStack_d0 = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_c8 = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    uStack_c0 = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_b8 = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    uStack_b0 = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
    local_a8 = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
    uStack_a0 = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
    local_98 = (eps->m_backend).exp;
    local_94 = (eps->m_backend).neg;
    local_90._0_4_ = (eps->m_backend).fpclass;
    local_90._4_4_ = (eps->m_backend).prec_elem;
    eps_00.m_backend.data._M_elems[2] = uVar21;
    eps_00.m_backend.data._M_elems._0_8_ = &local_d8;
    eps_00.m_backend.data._M_elems[3] = iVar22;
    eps_00.m_backend.data._M_elems[4] = fVar23;
    eps_00.m_backend.data._M_elems[5] = iVar24;
    eps_00.m_backend.data._M_elems[6] = (int)lVar20;
    eps_00.m_backend.data._M_elems[7] = (int)((ulong)lVar20 >> 0x20);
    eps_00.m_backend.data._M_elems[8] = in_stack_fffffffffffffdd8;
    eps_00.m_backend.data._M_elems[9] = pcol;
    eps_00.m_backend.data._M_elems[10] = (int)lVar19;
    eps_00.m_backend.data._M_elems[0xb] = uVar26;
    eps_00.m_backend.data._M_elems[0xc] = (uint)uVar27;
    eps_00.m_backend.data._M_elems[0xd] = SUB84(uVar27,4);
    eps_00.m_backend.data._M_elems[0xe] = (uint)uVar28;
    eps_00.m_backend.data._M_elems[0xf] = SUB84(uVar28,4);
    eps_00.m_backend._64_8_ = uVar29;
    eps_00.m_backend.fpclass = (uint)uVar30;
    eps_00.m_backend.prec_elem = SUB84(uVar30,4);
    local_178.m_backend.data._M_elems._0_8_ = uVar27;
    local_178.m_backend.data._M_elems._8_8_ = uVar28;
    local_178.m_backend.data._M_elems._16_8_ = uVar29;
    local_178.m_backend.data._M_elems._24_8_ = uVar30;
    local_178.m_backend.data._M_elems._32_8_ = uVar8;
    local_178.m_backend.data._M_elems._40_8_ = uVar9;
    local_178.m_backend.data._M_elems._48_8_ = uVar10;
    local_178.m_backend.data._M_elems._56_8_ = uVar11;
    local_178.m_backend.exp = iVar24;
    local_178.m_backend.fpclass = fVar23;
    local_178.m_backend.prec_elem = iVar22;
    updateRow(this,iVar25,iVar13,prow,pcol,&local_178,eps_00);
    iVar13 = iVar13 + 1;
  }
  iVar25 = (this->u).col.len[lVar20];
  for (lVar19 = (long)((int)lVar15 + 1); (int)lVar19 < iVar25; lVar19 = lVar19 + 1) {
    local_1c8.m_backend.neg = SUB41((uint)uVar21 >> 0x18,0);
    local_128 = *(undefined8 *)(eps->m_backend).data._M_elems;
    uStack_120 = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
    local_118 = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
    uStack_110 = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
    local_108 = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
    uStack_100 = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
    local_f8 = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
    uStack_f0 = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
    local_e8 = (eps->m_backend).exp;
    local_e4 = (eps->m_backend).neg;
    local_e0._0_4_ = (eps->m_backend).fpclass;
    local_e0._4_4_ = (eps->m_backend).prec_elem;
    eps_01.m_backend.data._M_elems[2] = uVar21;
    eps_01.m_backend.data._M_elems._0_8_ = &local_128;
    eps_01.m_backend.data._M_elems[3] = iVar22;
    eps_01.m_backend.data._M_elems[4] = fVar23;
    eps_01.m_backend.data._M_elems[5] = iVar24;
    eps_01.m_backend.data._M_elems[6] = (int)lVar20;
    eps_01.m_backend.data._M_elems[7] = (int)((ulong)lVar20 >> 0x20);
    eps_01.m_backend.data._M_elems[8] = in_stack_fffffffffffffdd8;
    eps_01.m_backend.data._M_elems[9] = pcol;
    eps_01.m_backend.data._M_elems[10] = iVar25;
    eps_01.m_backend.data._M_elems[0xb] = uVar26;
    eps_01.m_backend.data._M_elems[0xc] = (uint)uVar27;
    eps_01.m_backend.data._M_elems[0xd] = SUB84(uVar27,4);
    eps_01.m_backend.data._M_elems[0xe] = (uint)uVar28;
    eps_01.m_backend.data._M_elems[0xf] = SUB84(uVar28,4);
    eps_01.m_backend._64_8_ = uVar29;
    eps_01.m_backend.fpclass = (uint)uVar30;
    eps_01.m_backend.prec_elem = SUB84(uVar30,4);
    local_1c8.m_backend.data._M_elems._0_8_ = uVar27;
    local_1c8.m_backend.data._M_elems._8_8_ = uVar28;
    local_1c8.m_backend.data._M_elems._16_8_ = uVar29;
    local_1c8.m_backend.data._M_elems._24_8_ = uVar30;
    local_1c8.m_backend.data._M_elems._32_8_ = uVar8;
    local_1c8.m_backend.data._M_elems._40_8_ = uVar9;
    local_1c8.m_backend.data._M_elems._48_8_ = uVar10;
    local_1c8.m_backend.data._M_elems._56_8_ = uVar11;
    local_1c8.m_backend.exp = iVar24;
    local_1c8.m_backend.fpclass = fVar23;
    local_1c8.m_backend.prec_elem = iVar22;
    updateRow(this,(this->u).col.idx[(this->u).col.start[lVar20] + lVar19],iVar13,prow,pcol,
              &local_1c8,eps_01);
    iVar13 = iVar13 + 1;
  }
  piVar2 = (this->u).col.len + lVar20;
  *piVar2 = *piVar2 - (this->temp).s_cact[lVar20];
  lVar19 = (long)(this->u).row.start[prow];
  lVar15 = iVar16 + lVar19;
  for (; lVar19 < lVar15; lVar19 = lVar19 + 1) {
    iVar13 = (this->u).row.idx[lVar19];
    boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator=
              (&this->work[iVar13].m_backend,0);
    (this->temp).s_mark[iVar13] = 0;
    pPVar4 = (this->temp).pivot_colNZ;
    pPVar5 = (this->temp).pivot_col;
    iVar25 = (this->temp).s_cact[iVar13];
    pPVar6 = pPVar4[iVar25].next;
    pPVar5[iVar13].next = pPVar6;
    pPVar6->prev = pPVar5 + iVar13;
    pPVar5[iVar13].prev = pPVar4 + iVar25;
    pPVar4[iVar25].next = pPVar5 + iVar13;
  }
  return;
}

Assistant:

void CLUFactor<R>::eliminatePivot(int prow, int pos, R eps)
{
   int i, j, k, m = -1;
   int lv = -1;  // This value should never be used.
   int pcol;
   R pval;
   int pbeg = u.row.start[prow];
   int plen = --(u.row.len[prow]);
   int pend = pbeg + plen;


   /*  extract pivot element   */
   i = pbeg + pos;
   pcol = u.row.idx[i];
   pval = u.row.val[i];
   removeDR(temp.pivot_col[pcol]);
   initDR(temp.pivot_col[pcol]);

   /*  remove pivot from pivot row     */
   u.row.idx[i] = u.row.idx[pend];
   u.row.val[i] = u.row.val[pend];

   /*  set pivot element and construct L VectorBase<R> */
   setPivot(temp.stage++, pcol, prow, pval);

   /**@todo If this test failes, lv has no value. I suppose that in this
    *       case none of the loops below that uses lv is executed.
    *       But this is unproven.
    */

   if(temp.s_cact[pcol] - 1 > 0)
      lv = makeLvec(temp.s_cact[pcol] - 1, prow);

   /*  init working VectorBase<R>,
    *  remove pivot row from working matrix
    *  and remove columns from list.
    */
   for(i = pbeg; i < pend; ++i)
   {
      j = u.row.idx[i];
      temp.s_mark[j] = 1;
      work[j] = u.row.val[i];
      removeDR(temp.pivot_col[j]);
      m = u.col.start[j] + u.col.len[j] - temp.s_cact[j];

      for(k = m; u.col.idx[k] != prow; ++k)
         ;

      u.col.idx[k] = u.col.idx[m];

      u.col.idx[m] = prow;

      temp.s_cact[j]--;
   }

   /*  perform L and update loop
    */
   for(i = u.col.len[pcol] - temp.s_cact[pcol];
         (m = u.col.idx[u.col.start[pcol] + i]) != prow;
         ++i)
   {
      assert(row.perm[m] < 0);
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(m, lv++, prow, pcol, pval, eps);
   }

   /*  skip pivot row  */

   m = u.col.len[pcol];

   for(++i; i < m; ++i)
   {
      assert(lv >= 0);
      /* coverity[negative_returns] */
      updateRow(u.col.idx[u.col.start[pcol] + i], lv++, prow, pcol, pval, eps);
   }

   /*  remove pivot column from column file.
    */
   u.col.len[pcol] -= temp.s_cact[pcol];

   /*  clear working VectorBase<R> and reinsert columns to lists
    */
   for(i = u.row.start[prow], pend = i + plen; i < pend; ++i)
   {
      j = u.row.idx[i];
      work[j] = 0;
      temp.s_mark[j] = 0;
      init2DR(temp.pivot_col[j], temp.pivot_colNZ[temp.s_cact[j]]);
      assert(col.perm[j] < 0);
   }
}